

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void google::protobuf::SourceCodeInfo_Location::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  _func_int **pp_Var1;
  ulong uVar2;
  Arena *extraout_RDX;
  Arena *pAVar3;
  uint unaff_EBP;
  string *value;
  MessageLite *this;
  
  if (from_msg == to_msg) {
    value = (string *)to_msg;
    this = from_msg;
    MergeImpl();
    pAVar3 = extraout_RDX;
LAB_00f277d5:
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
LAB_00f2776c:
    protobuf::internal::ArenaStringPtr::Set<>((ArenaStringPtr *)this,value,pAVar3);
  }
  else {
    RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)&to_msg[1]._internal_metadata_,
               (RepeatedField<int> *)&from_msg[1]._internal_metadata_);
    RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)(to_msg + 3),(RepeatedField<int> *)(from_msg + 3));
    if (*(int *)&from_msg[5]._vptr_MessageLite != 0) {
      protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
                ((RepeatedPtrFieldBase *)&to_msg[4]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[4]._internal_metadata_);
    }
    unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((unaff_EBP & 3) == 0) goto LAB_00f27795;
    if ((unaff_EBP & 1) != 0) {
      pp_Var1 = from_msg[6]._vptr_MessageLite;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
      value = (string *)((ulong)pp_Var1 & 0xfffffffffffffffc);
      this = to_msg + 6;
      pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar3 & 1) != 0) goto LAB_00f277d5;
      goto LAB_00f2776c;
    }
  }
  if ((unaff_EBP & 2) != 0) {
    uVar2 = from_msg[6]._internal_metadata_.ptr_;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 2;
    pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar3 & 1) != 0) {
      pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[6]._internal_metadata_,
               (string *)(uVar2 & 0xfffffffffffffffc),pAVar3);
  }
LAB_00f27795:
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | unaff_EBP;
  uVar2 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar2 & 1) == 0) {
    return;
  }
  protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void SourceCodeInfo_Location::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<SourceCodeInfo_Location*>(&to_msg);
  auto& from = static_cast<const SourceCodeInfo_Location&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.SourceCodeInfo.Location)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_path()->MergeFrom(from._internal_path());
  _this->_internal_mutable_span()->MergeFrom(from._internal_span());
  _this->_internal_mutable_leading_detached_comments()->MergeFrom(from._internal_leading_detached_comments());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_leading_comments(from._internal_leading_comments());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_trailing_comments(from._internal_trailing_comments());
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}